

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserBase.cpp
# Opt level: O0

Token __thiscall slang::parsing::ParserBase::expect(ParserBase *this,TokenKind kind)

{
  bool bVar1;
  reference pTVar2;
  long in_RDI;
  TokenKind in_stack_00000076;
  Diagnostics *in_stack_00000078;
  BumpAllocator *in_stack_00000080;
  Token matchingDelim;
  Token result;
  undefined1 in_stack_000000c0 [16];
  ParserBase *in_stack_ffffffffffffff48;
  SmallVectorBase<slang::parsing::Token> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  ParserBase *in_stack_ffffffffffffff60;
  ParserBase *in_stack_ffffffffffffff70;
  pair<slang::parsing::Token,_slang::parsing::Token> local_50;
  undefined8 local_30;
  Info *local_28;
  Token local_10;
  
  bVar1 = peek(in_stack_ffffffffffffff60,(TokenKind)((ulong)in_stack_ffffffffffffff58 >> 0x30));
  if (bVar1) {
    local_10 = consume(in_stack_ffffffffffffff70);
  }
  else {
    Token::Token((Token *)in_stack_ffffffffffffff50);
    bVar1 = slang::syntax::SyntaxFacts::isCloseDelimOrKeyword(Unknown);
    if ((bVar1) &&
       (bVar1 = SmallVectorBase<slang::parsing::Token>::empty
                          ((SmallVectorBase<slang::parsing::Token> *)(in_RDI + 0x88)), !bVar1)) {
      SmallVectorBase<slang::parsing::Token>::back
                ((SmallVectorBase<slang::parsing::Token> *)(in_RDI + 0x88));
      bVar1 = slang::syntax::SyntaxFacts::isMatchingDelims(Unknown,AlwaysFFKeyword);
      if (bVar1) {
        pTVar2 = SmallVectorBase<slang::parsing::Token>::back
                           ((SmallVectorBase<slang::parsing::Token> *)(in_RDI + 0x88));
        local_30._0_2_ = pTVar2->kind;
        local_30._2_1_ = pTVar2->field_0x2;
        local_30._3_1_ = pTVar2->numFlags;
        local_30._4_4_ = pTVar2->rawLen;
        local_28 = pTVar2->info;
        SmallVectorBase<slang::parsing::Token>::pop_back(in_stack_ffffffffffffff50);
      }
      else {
        SmallVectorBase<slang::parsing::Token>::clear(in_stack_ffffffffffffff50);
      }
      std::pair<slang::parsing::Token,_slang::parsing::Token>::
      pair<slang::parsing::Token,_slang::parsing::Token,_true>
                ((pair<slang::parsing::Token,_slang::parsing::Token> *)in_stack_ffffffffffffff50);
      std::pair<slang::parsing::Token,_slang::parsing::Token>::operator=
                ((pair<slang::parsing::Token,_slang::parsing::Token> *)(in_RDI + 0xc0),&local_50);
    }
    getDiagnostics((ParserBase *)0x61780d);
    peek(in_stack_ffffffffffffff48);
    local_10 = Token::createExpected
                         (in_stack_00000080,in_stack_00000078,matchingDelim,in_stack_00000076,
                          (Token)stack0x000000b0,(Token)in_stack_000000c0);
  }
  return local_10;
}

Assistant:

Token ParserBase::expect(TokenKind kind) {
    if (peek(kind))
        return consume();

    // If this needs to be an end delimiter, see if we know the
    // corresponding open delimiter and if so use that to produce
    // a better error.
    Token matchingDelim;
    if (SF::isCloseDelimOrKeyword(kind) && !openDelims.empty()) {
        if (SF::isMatchingDelims(openDelims.back().kind, kind)) {
            matchingDelim = openDelims.back();
            openDelims.pop_back();
        }
        else {
            // If we hit this point assume that our stack of delims has
            // become unbalanced and flush it.
            openDelims.clear();
        }
        lastPoppedDelims = {};
    }

    Token result = Token::createExpected(alloc, getDiagnostics(), peek(), kind, window.lastConsumed,
                                         matchingDelim);
    return result;
}